

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int default_emit_certificate_cb
              (ptls_emit_certificate_t *_self,ptls_t *tls,ptls_message_emitter_t *emitter,
              ptls_key_schedule_t *key_sched,ptls_iovec_t context,int push_status_request,
              uint16_t *compress_algos,size_t num_compress_algos)

{
  ptls_buffer_t *buf;
  size_t sVar1;
  uint8_t *puVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  size_t sVar6;
  ptls_hash_context_t **pppVar7;
  size_t sVar8;
  
  iVar3 = (*emitter->begin_message)(emitter);
  if (iVar3 == 0) {
    buf = emitter->buf;
    sVar1 = buf->off;
    iVar3 = ptls_buffer_reserve_aligned(buf,1,'\0');
    if (iVar3 == 0) {
      buf->base[buf->off] = '\v';
      buf->off = buf->off + 1;
      iVar3 = ptls_buffer_reserve_aligned(buf,3,'\0');
      if (iVar3 == 0) {
        puVar2 = buf->base;
        sVar6 = buf->off;
        puVar2[sVar6 + 2] = '\0';
        puVar2 = puVar2 + sVar6;
        puVar2[0] = '\0';
        puVar2[1] = '\0';
        sVar6 = buf->off;
        buf->off = sVar6 + 3;
        iVar3 = ptls_build_certificate_message
                          (emitter->buf,context,(tls->ctx->certificates).list,
                           (tls->ctx->certificates).count,(ptls_iovec_t)ZEXT816(0));
        if (iVar3 == 0) {
          uVar5 = buf->off - (sVar6 + 3);
          iVar3 = 0x20c;
          if (uVar5 < 0x1000000) {
            lVar4 = 0x10;
            do {
              buf->base[sVar6] = (uint8_t)(uVar5 >> ((byte)lVar4 & 0x3f));
              lVar4 = lVar4 + -8;
              sVar6 = sVar6 + 1;
            } while (lVar4 != -8);
            if ((key_sched != (ptls_key_schedule_t *)0x0) && (key_sched->num_hashes != 0)) {
              puVar2 = buf->base;
              sVar6 = buf->off;
              pppVar7 = &key_sched->hashes[0].ctx;
              sVar8 = 0;
              do {
                (*(*pppVar7)->update)(*pppVar7,puVar2 + sVar1,sVar6 - sVar1);
                sVar8 = sVar8 + 1;
                pppVar7 = pppVar7 + 3;
              } while (sVar8 != key_sched->num_hashes);
            }
            iVar3 = (*emitter->commit_message)(emitter);
            return iVar3;
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

static int default_emit_certificate_cb(ptls_emit_certificate_t *_self, ptls_t *tls, ptls_message_emitter_t *emitter,
                                       ptls_key_schedule_t *key_sched, ptls_iovec_t context, int push_status_request,
                                       const uint16_t *compress_algos, size_t num_compress_algos)
{
    int ret;

    ptls_push_message(emitter, key_sched, PTLS_HANDSHAKE_TYPE_CERTIFICATE, {
        if ((ret = ptls_build_certificate_message(emitter->buf, context, tls->ctx->certificates.list, tls->ctx->certificates.count,
                                                  ptls_iovec_init(NULL, 0))) != 0)
            goto Exit;
    });

    ret = 0;
Exit:
    return ret;
}